

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkPrintStats(Wlc_Ntk_t *p,int fDistrib,int fVerbose)

{
  int iVar1;
  int fVerbose_00;
  long lVar2;
  
  printf("%-20s : ",p->pName);
  printf("PI = %4d  ",(ulong)(uint)(p->vPis).nSize);
  printf("PO = %4d  ",(ulong)(uint)(p->vPos).nSize);
  printf("FF = %4d  ",(ulong)(uint)((p->vCis).nSize - (p->vPis).nSize));
  fVerbose_00 = p->iObj + -1;
  printf("Obj = %6d  ");
  iVar1 = Wlc_NtkMemUsage(p);
  printf("Mem = %.3f MB",(double)iVar1 * 9.5367431640625e-07);
  putchar(10);
  if (fDistrib != 0) {
    Wlc_NtkPrintDistrib(p,fVerbose_00);
    return;
  }
  if (fVerbose != 0) {
    puts("Node type statistics:");
    lVar2 = 0;
    do {
      if (p->nObjs[lVar2 + 1] != 0) {
        if ((p->nAnds[0] == 0) || (p->nAnds[lVar2 + 1] == 0)) {
          printf("%2d  :  %-8s  %6d\n",(ulong)((int)lVar2 + 1),Wlc_Names[lVar2 + 1]);
        }
        else {
          printf("%2d  :  %-8s  %6d  %7.2f %%\n",
                 ((double)p->nAnds[lVar2 + 1] * 100.0) / (double)p->nAnds[0],(ulong)((int)lVar2 + 1)
                 ,Wlc_Names[lVar2 + 1]);
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x2c);
  }
  return;
}

Assistant:

void Wlc_NtkPrintStats( Wlc_Ntk_t * p, int fDistrib, int fVerbose )
{
    int i;
    printf( "%-20s : ",        p->pName );
    printf( "PI = %4d  ",      Wlc_NtkPiNum(p) );
    printf( "PO = %4d  ",      Wlc_NtkPoNum(p) );
    printf( "FF = %4d  ",      Wlc_NtkFfNum(p) );
    printf( "Obj = %6d  ",     Wlc_NtkObjNum(p) );
    printf( "Mem = %.3f MB",   1.0*Wlc_NtkMemUsage(p)/(1<<20) );
    printf( "\n" );
    if ( fDistrib )
    {
        Wlc_NtkPrintDistrib( p, fVerbose );
        return;
    }
    if ( !fVerbose )
        return;
    printf( "Node type statistics:\n" );
    for ( i = 1; i < WLC_OBJ_NUMBER; i++ )
    {
        if ( !p->nObjs[i] )
            continue;
        if ( p->nAnds[0] && p->nAnds[i] )
            printf( "%2d  :  %-8s  %6d  %7.2f %%\n", i, Wlc_Names[i], p->nObjs[i], 100.0*p->nAnds[i]/p->nAnds[0] );
        else
            printf( "%2d  :  %-8s  %6d\n", i, Wlc_Names[i], p->nObjs[i] );
    }
}